

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc_ball_view.cpp
# Opt level: O2

void __thiscall
lumeview::ArcBallView::mouse_button(ArcBallView *this,int button,int action,int mods)

{
  bool bVar1;
  Camera *this_00;
  View *this_01;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  vec3 vVar2;
  anon_union_8_3_e2189aaa_for_tvec2<float,_(glm::precision)0>_2 local_50;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_48;
  undefined1 local_38 [16];
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_28;
  
  WindowEventListener::mouse_button(&this->super_WindowEventListener,button,action,mods);
  if (button == 0) {
    if (action == 0) {
      if ((this->m_arcBall).m_dragging == true) {
        ArcBall::end_drag(&this->m_arcBall);
        return;
      }
    }
    else if (action == 1) {
      local_50.field_0 =
           (anon_struct_8_2_947311e6_for_anon_union_8_3_e2189aaa_for_tvec2<float,_(glm::precision)0>_2_0
            )WindowEventListener::cursor_position(&this->super_WindowEventListener);
      local_38._8_4_ = extraout_XMM0_Dc;
      local_38._0_8_ = local_50;
      local_38._12_4_ = extraout_XMM0_Dd;
      bVar1 = WindowEventListener::was_double_click(&this->super_WindowEventListener,0);
      if (bVar1) {
        ArcBall::end_drag(&this->m_arcBall);
        this_01 = &this->m_view;
        local_28.field_0.z = View::depth_at_screen_coord(this_01,(vec2 *)&local_50.field_0);
        if (local_28.field_0.z < 1.0) {
          local_28._0_8_ = local_50;
          vVar2 = View::unproject(this_01,(vec3 *)&local_28.field_0);
          local_48.field_0.z = (float)vVar2.field_0._8_4_;
          local_48._0_8_ = vVar2.field_0._0_8_;
          this_00 = View::camera(this_01);
          Camera::set_translation(this_00,(vec3 *)&local_48.field_0);
        }
      }
      else {
        local_48._0_8_ = local_38._0_8_;
        ArcBall::begin_drag(&this->m_arcBall,(vec2 *)&local_48.field_0);
      }
    }
  }
  return;
}

Assistant:

void ArcBallView::mouse_button (int button, int action, int mods)
{
	base_t::mouse_button (button, action, mods);

	if(button == MouseButton::LEFT){
		switch(action) {
			case MouseButtonAction::DOWN: {
				const glm::vec2& cursorPos = base_t::cursor_position ();
				if (base_t::was_double_click (button)) {
					m_arcBall.end_drag ();
					float z = m_view.depth_at_screen_coord (cursorPos);
					if (z < 1.f) {
						glm::vec3 p = m_view.unproject (glm::vec3(cursorPos.x, cursorPos.y, z));
						m_view.camera().set_translation (p);
					}
				}
				else
					m_arcBall.begin_drag (glm::vec2(cursorPos.x, cursorPos.y));
			} break;

			case MouseButtonAction::UP: {
				if(m_arcBall.dragging ())
					m_arcBall.end_drag ();
			} break;
		}
	}
}